

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__compute_transparency16(stbi__png *z,stbi__uint16 *tc,int out_n)

{
  stbi_uc *psVar1;
  int in_EAX;
  int iVar2;
  long lVar3;
  
  psVar1 = z->out;
  iVar2 = z->s->img_y * z->s->img_x;
  if (out_n == 2) {
    if (iVar2 != 0) {
      lVar3 = 0;
      do {
        *(ushort *)(psVar1 + lVar3 * 4 + 2) =
             -(ushort)(*(stbi__uint16 *)(psVar1 + lVar3 * 4) != *tc);
        lVar3 = lVar3 + 1;
      } while (iVar2 != (int)lVar3);
    }
  }
  else {
    if (out_n != 4) {
      __assert_fail("out_n == 2 || out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                    ,0x11d9,"int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)");
    }
    if (iVar2 != 0) {
      lVar3 = 0;
      do {
        if (((*(stbi__uint16 *)(psVar1 + lVar3 * 8) == *tc) &&
            (*(stbi__uint16 *)(psVar1 + lVar3 * 8 + 2) == tc[1])) &&
           (*(stbi__uint16 *)(psVar1 + lVar3 * 8 + 4) == tc[2])) {
          (psVar1 + lVar3 * 8 + 6)[0] = '\0';
          (psVar1 + lVar3 * 8 + 6)[1] = '\0';
        }
        lVar3 = lVar3 + 1;
      } while (iVar2 != (int)lVar3);
    }
  }
  return in_EAX;
}

Assistant:

static int stbi__compute_transparency16(stbi__png *z, stbi__uint16 tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi__uint16 *p = (stbi__uint16*) z->out;

   // compute color-based transparency, assuming we've
   // already got 65535 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i = 0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 65535);
         p += 2;
      }
   } else {
      for (i = 0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}